

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

Result * __thiscall
CoreML::Model::addOutput
          (Result *__return_storage_ptr__,Model *this,string *targetName,FeatureType *targetType)

{
  element_type *this_00;
  ModelDescription *this_01;
  FeatureDescription *this_02;
  FeatureType *type;
  FeatureDescription *arg;
  ModelDescription *interface;
  FeatureType *targetType_local;
  string *targetName_local;
  Model *this_local;
  
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_spec);
  this_01 = Specification::Model::mutable_description(this_00);
  this_02 = Specification::ModelDescription::add_output(this_01);
  Specification::FeatureDescription::set_name(this_02,targetName);
  type = FeatureType::allocateCopy(targetType);
  Specification::FeatureDescription::set_allocated_type(this_02,type);
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result Model::addOutput(const std::string& targetName,
                            FeatureType targetType) {
        Specification::ModelDescription* interface = m_spec->mutable_description();
        Specification::FeatureDescription *arg = interface->add_output();
        arg->set_name(targetName);
        arg->set_allocated_type(targetType.allocateCopy());
        return Result();
    }